

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall itis::AVLTree<long>::insert(AVLTree<long> *this,long value)

{
  AVLTreeNode<long> *this_00;
  AVLTreeNode<long> **indirect;
  vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> path;
  _Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> local_38;
  
  path.super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  path.super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (indirect = &this->root; *indirect != (AVLTreeNode<long> *)0x0;
      indirect = &(*indirect)->right + (value < (*indirect)->value)) {
    std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::push_back
              (&path,&indirect);
  }
  this_00 = (AVLTreeNode<long> *)operator_new(0x20);
  AVLTreeNode<long>::AVLTreeNode(this_00,value);
  *indirect = this_00;
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::push_back
            (&path,&indirect);
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::vector
            ((vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
             &local_38,&path);
  balance(this,(vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
               &local_38);
  std::_Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::
  ~_Vector_base(&local_38);
  this->_size = this->_size + 1;
  std::_Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::
  ~_Vector_base(&path.
                 super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
               );
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }